

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall cmDebugger_impl::SetState(cmDebugger_impl *this,t newState)

{
  t tVar1;
  _Base_ptr p_Var2;
  
  if ((this->state)._M_i == Unknown) {
    LOCK();
    (this->state)._M_i = newState;
    UNLOCK();
  }
  else {
    tVar1 = (this->state)._M_i;
    LOCK();
    (this->state)._M_i = newState;
    UNLOCK();
    if (tVar1 != newState) {
      for (p_Var2 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        (**(code **)(**(long **)(p_Var2 + 1) + 0x10))();
      }
    }
  }
  return;
}

Assistant:

void SetState(State::t newState)
  {
    bool notifyListeners = state != State::Unknown && state != newState;
    state = newState;
    if (!notifyListeners) {
      return;
    }

    for (auto& l : listeners) {
      l->OnChangeState();
    }
  }